

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O2

void __thiscall gutil::Exception::Exception(Exception *this,string *type,string *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  *(undefined ***)this = &PTR__Exception_0015b840;
  std::operator+(&local_30,type,": ");
  std::operator+(&this->s,&local_30,message);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

Exception::Exception(const std::string &type, const std::string &message): s(type+": "+message)
{
#if defined(DEBUG) && defined(__GNUC__)
  std::ostringstream os;
  void *ptr[64];
  int nptr=backtrace(ptr, 64);
  char **sym=backtrace_symbols(ptr, nptr);

  for (int i=1; i<nptr-1; i++)
  {
    os << sym[i] << "\n";
  }

  if (nptr > 1)
  {
    os << sym[nptr-1];
  }

  free(sym);

  bt=os.str();
#endif
}